

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

int conv_num(char **buf,int *dest,int llim,int ulim)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int rulim;
  char *pcVar4;
  int iVar5;
  
  if (0xf5 < (byte)(**buf - 0x3aU)) {
    iVar3 = 0;
    iVar5 = ulim;
    pcVar2 = *buf;
    do {
      pcVar4 = pcVar2 + 1;
      *buf = pcVar4;
      iVar1 = iVar3 * 10;
      iVar3 = (int)*pcVar2 + iVar3 * 10 + -0x30;
      if ((ulim < ((*pcVar2 + iVar1) * 2 + -0x60) * 5) || (0xffffffec < iVar5 - 10U)) break;
      iVar5 = iVar5 / 10;
      pcVar2 = pcVar4;
    } while ((byte)(*pcVar4 - 0x30U) < 10);
    if (iVar3 <= ulim && llim <= iVar3) {
      *dest = iVar3;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int conv_num(const char * *buf, int * dest, int llim, int ulim) {
	int result = 0;

	/* The limit also determines the number of valid digits. */
	int rulim = ulim;

	if (**buf < '0' || ** buf > '9') {
		return (0);
	}

	do {
		result *= 10;
		result += *(*buf)++ - '0';
		rulim /= 10;
	} while ((result * 10 <= ulim) && rulim && ** buf >= '0' && ** buf <= '9');

	if (result < llim || result > ulim) {
		return (0);
	}

	*dest = result;
	return (1);
}